

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

int __thiscall CTcTokenizer::look_ahead(CTcTokenizer *this,char *s1,char *s2)

{
  tc_toktyp_t tVar1;
  int iVar2;
  CTcTokenizer *in_RDX;
  char *in_RSI;
  CTcTokenizer *in_RDI;
  
  tVar1 = cur((CTcTokenizer *)0x2e47a2);
  if (tVar1 == TOKT_SYM) {
    strlen(in_RSI);
    iVar2 = cur_tok_matches(in_RDX,(char *)in_RDI,(size_t)in_RSI);
    if (iVar2 != 0) {
      tVar1 = next(in_RDI);
      if (tVar1 == TOKT_SYM) {
        strlen((char *)in_RDX);
        iVar2 = cur_tok_matches(in_RDX,(char *)in_RDI,(size_t)in_RSI);
        if (iVar2 != 0) {
          next(in_RDI);
          return 1;
        }
      }
      unget((CTcTokenizer *)0x2e4832);
      return 0;
    }
  }
  return 0;
}

Assistant:

int CTcTokenizer::look_ahead(const char *s1, const char *s2)
{
    /* if the first token doesn't match, the sequence doesn't match */
    if (cur() != TOKT_SYM || !cur_tok_matches(s1, strlen(s1)))
        return FALSE;

    /* check the next token - if it matches, we have a sequence match */
    if (next() == TOKT_SYM && cur_tok_matches(s2, strlen(s2)))
    {
        /* got it - skip the second token and return success */
        next();
        return TRUE;
    }

    /* 
     *   no match - but we've already read the next token, so put it back
     *   before we return failure 
     */
    unget();
    return FALSE;
}